

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.cpp
# Opt level: O1

bool __thiscall GenericAssemblerFile::seekVirtual(GenericAssemblerFile *this,u64 virtualAddress)

{
  ulong uVar1;
  FILE *__stream;
  int iVar2;
  
  uVar1 = this->headerSize;
  if (virtualAddress < uVar1) {
    Logger::queueError<>(Error,L"Seeking to invalid address");
  }
  else {
    this->virtualAddress = virtualAddress;
    iVar2 = (*(this->super_AssemblerFile)._vptr_AssemblerFile[2])();
    if (((char)iVar2 != '\0') && (__stream = (FILE *)(this->handle).handle, __stream != (FILE *)0x0)
       ) {
      fseek(__stream,virtualAddress - uVar1,0);
    }
  }
  return uVar1 <= virtualAddress;
}

Assistant:

bool GenericAssemblerFile::seekVirtual(u64 virtualAddress)
{
	if (virtualAddress < headerSize)
	{
		Logger::queueError(Logger::Error,L"Seeking to invalid address");
		return false;
	}

	this->virtualAddress = virtualAddress;
	u64 physicalAddress = virtualAddress-headerSize;

	if (isOpen())
		handle.setPos((long)physicalAddress);

	return true;
}